

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

int Abc_TgNextPermutation(Abc_TgMan_t *pMan)

{
  char *pData;
  char cVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint size;
  long lVar8;
  char *pDir;
  
  lVar8 = 0;
  do {
    if (pMan->nGroups <= lVar8) {
      return 0;
    }
    cVar1 = pMan->pGroup[lVar8].nGVars;
    size = (uint)cVar1;
    if (size != 1) {
      cVar2 = pMan->pGroup[lVar8].iStart;
      pData = pMan->pPerm + cVar2;
      pDir = pMan->pPermDir + cVar2;
      uVar5 = 0;
      if ('\0' < cVar1) {
        uVar5 = (ulong)size;
      }
      uVar7 = 0xffffffffffffffff;
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        iVar3 = (int)((uint)(int)pDir[uVar6] + uVar6);
        if ((((-1 < iVar3) && (iVar3 < (int)size)) &&
            (pData[(uint)(int)pDir[uVar6] + uVar6 & 0xffffffff] < pDir[uVar6 - 0x30])) &&
           (((int)uVar7 < 0 || (pData[uVar7 & 0xffffffff] < pDir[uVar6 - 0x30])))) {
          uVar7 = uVar6 & 0xffffffff;
        }
      }
      uVar6 = uVar7 & 0xffffffff;
      if ((int)uVar7 < 1) {
        uVar6 = 0;
      }
      for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        if (pData[uVar6] < pDir[uVar7 - 0x30]) {
          pDir[uVar7] = -pDir[uVar7];
        }
      }
      uVar4 = (int)pDir[uVar6] + (int)uVar6;
      if (-1 < (int)uVar4) {
        if ((int)uVar4 < (int)uVar6) {
          uVar6 = (ulong)uVar4;
        }
        Abc_TgSwapAdjacentSymGroups(pMan,(int)pMan->pGroup[lVar8].iStart + (int)uVar6);
        return 1;
      }
      Abc_TgSwapAdjacentSymGroups(pMan,(int)pMan->pGroup[lVar8].iStart);
      iVar3 = Abc_TgIsInitPerm(pData,pDir,size);
      if (iVar3 == 0) {
        __assert_fail("Abc_TgIsInitPerm(pVars, pDirs, nGvars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                      ,0x8b8,"int Abc_TgNextPermutation(Abc_TgMan_t *)");
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

static int Abc_TgNextPermutation(Abc_TgMan_t * pMan)
{
    int i, j, nGvars;
    TiedGroup * pGrp;
    char * pVars;
    signed char * pDirs;
    for (i = 0; i < pMan->nGroups; i++)
    {
        pGrp = pMan->pGroup + i;
        nGvars = pGrp->nGVars;
        if (nGvars == 1) continue;
        pVars = pMan->pPerm + pGrp->iStart;
        pDirs = pMan->pPermDir + pGrp->iStart;
        j = Abc_NextPermSwapC(pVars, pDirs, nGvars);
        if (j >= 0)
        {
            Abc_TgSwapAdjacentSymGroups(pMan, j + pGrp->iStart);
            return 1;
        }
        Abc_TgSwapAdjacentSymGroups(pMan, pGrp->iStart);
        assert(Abc_TgIsInitPerm(pVars, pDirs, nGvars));
    }
    return 0;
}